

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,OPJ_BYTE *p_dest,OPJ_UINT32 p_dest_length)

{
  size_t __n;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  OPJ_BYTE OVar9;
  undefined2 uVar10;
  opj_tcd_resolution_t *poVar11;
  OPJ_UINT32 OVar12;
  OPJ_BOOL OVar13;
  int iVar14;
  int iVar15;
  opj_tcd_resolution_t *poVar16;
  long lVar17;
  uint uVar18;
  opj_tcd_tilecomp_t *poVar19;
  int iVar20;
  opj_image_comp_t *poVar21;
  uint uVar22;
  int iVar23;
  OPJ_BYTE *__src;
  ulong uVar24;
  
  OVar12 = opj_tcd_get_decoded_tile_size(p_tcd,1);
  OVar13 = 0;
  if (OVar12 <= p_dest_length && OVar12 != 0xffffffff) {
    if (p_tcd->image->numcomps != 0) {
      poVar21 = p_tcd->image->comps;
      poVar19 = p_tcd->tcd_image->tiles->comps;
      uVar22 = 0;
      do {
        poVar11 = poVar19->resolutions;
        poVar16 = poVar11 + poVar21->resno_decoded;
        if (p_tcd->whole_tile_decoding == 0) {
          uVar3 = poVar16->win_x1;
          uVar7 = poVar16->win_y1;
          uVar4 = poVar16->win_x0;
          uVar8 = poVar16->win_y0;
          uVar24 = CONCAT44(uVar7 - uVar8,uVar3 - uVar4);
          uVar18 = 0;
          lVar17 = 0x50;
        }
        else {
          uVar1 = poVar16->x1;
          uVar5 = poVar16->y1;
          uVar2 = poVar16->x0;
          uVar6 = poVar16->y0;
          uVar24 = CONCAT44(uVar5 - uVar6,uVar1 - uVar2);
          uVar18 = poVar19->minimum_num_resolutions - 1;
          uVar18 = poVar11[uVar18].x1 - ((uVar1 - uVar2) + poVar11[uVar18].x0);
          lVar17 = 0x30;
        }
        __src = *(OPJ_BYTE **)((long)&poVar19->x0 + lVar17);
        iVar14 = ((poVar21->prec >> 3) + 1) - (uint)((poVar21->prec & 7) == 0);
        if (iVar14 == 3) {
          iVar14 = 4;
        }
        iVar15 = (int)uVar24;
        iVar23 = (int)(uVar24 >> 0x20);
        if (iVar14 == 1) {
          if (poVar21->sgnd == 0) {
            if (iVar23 != 0) {
              iVar20 = 0;
              iVar14 = iVar15;
              do {
                for (; iVar14 != 0; iVar14 = iVar14 + -1) {
                  OVar9 = *__src;
                  __src = __src + 4;
                  *p_dest = OVar9;
                  p_dest = p_dest + 1;
                }
                __src = __src + (ulong)uVar18 * 4;
                iVar20 = iVar20 + 1;
                iVar14 = iVar15;
              } while (iVar20 != iVar23);
            }
          }
          else if (iVar23 != 0) {
            iVar20 = 0;
            iVar14 = iVar15;
            do {
              for (; iVar14 != 0; iVar14 = iVar14 + -1) {
                OVar9 = *__src;
                __src = __src + 4;
                *p_dest = OVar9;
                p_dest = p_dest + 1;
              }
              __src = __src + (ulong)uVar18 * 4;
              iVar20 = iVar20 + 1;
              iVar14 = iVar15;
            } while (iVar20 != iVar23);
          }
        }
        else if (iVar14 == 2) {
          if (poVar21->sgnd == 0) {
            if (iVar23 != 0) {
              iVar20 = 0;
              iVar14 = iVar15;
              do {
                for (; iVar14 != 0; iVar14 = iVar14 + -1) {
                  uVar10 = *(undefined2 *)__src;
                  __src = __src + 4;
                  *(undefined2 *)p_dest = uVar10;
                  p_dest = p_dest + 2;
                }
                __src = __src + (ulong)uVar18 * 4;
                iVar20 = iVar20 + 1;
                iVar14 = iVar15;
              } while (iVar20 != iVar23);
            }
          }
          else if (iVar23 != 0) {
            iVar20 = 0;
            iVar14 = iVar15;
            do {
              for (; iVar14 != 0; iVar14 = iVar14 + -1) {
                uVar10 = *(undefined2 *)__src;
                __src = __src + 4;
                *(undefined2 *)p_dest = uVar10;
                p_dest = p_dest + 2;
              }
              __src = __src + (ulong)uVar18 * 4;
              iVar20 = iVar20 + 1;
              iVar14 = iVar15;
            } while (iVar20 != iVar23);
          }
        }
        else if ((iVar14 == 4) && (iVar23 != 0)) {
          __n = (uVar24 & 0xffffffff) * 4;
          do {
            memcpy(p_dest,__src,__n);
            __src = __src + (ulong)(uVar18 + iVar15) * 4;
            p_dest = p_dest + __n;
            iVar23 = iVar23 + -1;
          } while (iVar23 != 0);
        }
        poVar21 = poVar21 + 1;
        poVar19 = poVar19 + 1;
        uVar22 = uVar22 + 1;
      } while (uVar22 < p_tcd->image->numcomps);
    }
    OVar13 = 1;
  }
  return OVar13;
}

Assistant:

OPJ_BOOL opj_tcd_update_tile_data(opj_tcd_t *p_tcd,
                                  OPJ_BYTE * p_dest,
                                  OPJ_UINT32 p_dest_length
                                 )
{
    OPJ_UINT32 i, j, k, l_data_size = 0;
    opj_image_comp_t * l_img_comp = 00;
    opj_tcd_tilecomp_t * l_tilec = 00;
    opj_tcd_resolution_t * l_res;
    OPJ_UINT32 l_size_comp, l_remaining;
    OPJ_UINT32 l_stride, l_width, l_height;

    l_data_size = opj_tcd_get_decoded_tile_size(p_tcd, OPJ_TRUE);
    if (l_data_size == UINT_MAX || l_data_size > p_dest_length) {
        return OPJ_FALSE;
    }

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_img_comp = p_tcd->image->comps;

    for (i = 0; i < p_tcd->image->numcomps; ++i) {
        const OPJ_INT32* l_src_data;
        l_size_comp = l_img_comp->prec >> 3; /*(/ 8)*/
        l_remaining = l_img_comp->prec & 7;  /* (%8) */
        l_res = l_tilec->resolutions + l_img_comp->resno_decoded;
        if (p_tcd->whole_tile_decoding) {
            l_width = (OPJ_UINT32)(l_res->x1 - l_res->x0);
            l_height = (OPJ_UINT32)(l_res->y1 - l_res->y0);
            l_stride = (OPJ_UINT32)(l_tilec->resolutions[l_tilec->minimum_num_resolutions -
                                                                     1].x1 -
                                    l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x0) - l_width;
            l_src_data = l_tilec->data;
        } else {
            l_width = l_res->win_x1 - l_res->win_x0;
            l_height = l_res->win_y1 - l_res->win_y0;
            l_stride = 0;
            l_src_data = l_tilec->data_win;
        }

        if (l_remaining) {
            ++l_size_comp;
        }

        if (l_size_comp == 3) {
            l_size_comp = 4;
        }

        switch (l_size_comp) {
        case 1: {
            OPJ_CHAR * l_dest_ptr = (OPJ_CHAR *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)(*(l_src_ptr++));
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        *(l_dest_ptr++) = (OPJ_CHAR)((*(l_src_ptr++)) & 0xff);
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE *)l_dest_ptr;
        }
        break;
        case 2: {
            const OPJ_INT32 * l_src_ptr = l_src_data;
            OPJ_INT16 * l_dest_ptr = (OPJ_INT16 *) p_dest;

            if (l_img_comp->sgnd) {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)(*(l_src_ptr++));
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            } else {
                for (j = 0; j < l_height; ++j) {
                    for (k = 0; k < l_width; ++k) {
                        OPJ_INT16 val = (OPJ_INT16)((*(l_src_ptr++)) & 0xffff);
                        memcpy(l_dest_ptr, &val, sizeof(val));
                        l_dest_ptr ++;
                    }
                    l_src_ptr += l_stride;
                }
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        case 4: {
            OPJ_INT32 * l_dest_ptr = (OPJ_INT32 *) p_dest;
            const OPJ_INT32 * l_src_ptr = l_src_data;

            for (j = 0; j < l_height; ++j) {
                memcpy(l_dest_ptr, l_src_ptr, l_width * sizeof(OPJ_INT32));
                l_dest_ptr += l_width;
                l_src_ptr += l_width + l_stride;
            }

            p_dest = (OPJ_BYTE*) l_dest_ptr;
        }
        break;
        }

        ++l_img_comp;
        ++l_tilec;
    }

    return OPJ_TRUE;
}